

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int do_floor(vorb *f,Mapping *map,int i,int n,float *target,YTYPE *finalY,uint8 *step2_flag)

{
  Floor *pFVar1;
  int n_00;
  uint uVar2;
  uint uVar3;
  int y1;
  uint x1;
  int hx;
  int hy;
  int ly;
  int lx;
  int q;
  int j;
  Floor1 *g;
  int floor;
  int s;
  int n2;
  YTYPE *finalY_local;
  float *target_local;
  int n_local;
  int i_local;
  Mapping *map_local;
  vorb *f_local;
  
  n_00 = n >> 1;
  uVar2 = (uint)map->submap_floor[(int)(uint)map->chan[i].mux];
  if (f->floor_types[(int)uVar2] == 0) {
    f_local._4_4_ = error(f,VORBIS_invalid_stream);
  }
  else {
    pFVar1 = f->floor_config;
    hy = 0;
    hx = (int)*finalY * (uint)(&pFVar1->floor1)[(int)uVar2].floor1_multiplier;
    for (ly = 1; ly < (&pFVar1->floor1)[(int)uVar2].values; ly = ly + 1) {
      uVar3 = (uint)*(byte *)((long)pFVar1 + (long)ly + (long)(int)uVar2 * 0x63c + 0x346);
      y1 = hx;
      x1 = hy;
      if (-1 < finalY[(int)uVar3]) {
        y1 = (int)finalY[(int)uVar3] * (uint)(&pFVar1->floor1)[(int)uVar2].floor1_multiplier;
        x1 = (uint)*(ushort *)
                    ((long)pFVar1 + (long)(int)uVar3 * 2 + (long)(int)uVar2 * 0x63c + 0x152);
        if (hy != x1) {
          draw_line(target,hy,hx,x1,y1,n_00);
        }
      }
      hy = x1;
      hx = y1;
    }
    if (hy < n_00) {
      for (lx = hy; lx < n_00; lx = lx + 1) {
        target[lx] = inverse_db_table[hx] * target[lx];
      }
    }
    f_local._4_4_ = 1;
  }
  return f_local._4_4_;
}

Assistant:

static int do_floor(vorb *f, Mapping *map, int i, int n, float *target, YTYPE *finalY, uint8 *step2_flag)
{
   int n2 = n >> 1;
   int s = map->chan[i].mux, floor;
   floor = map->submap_floor[s];
   if (f->floor_types[floor] == 0) {
      return error(f, VORBIS_invalid_stream);
   } else {
      Floor1 *g = &f->floor_config[floor].floor1;
      int j,q;
      int lx = 0, ly = finalY[0] * g->floor1_multiplier;
      for (q=1; q < g->values; ++q) {
         j = g->sorted_order[q];
         #ifndef STB_VORBIS_NO_DEFER_FLOOR
         if (finalY[j] >= 0)
         #else
         if (step2_flag[j])
         #endif
         {
            int hy = finalY[j] * g->floor1_multiplier;
            int hx = g->Xlist[j];
            if (lx != hx)
               draw_line(target, lx,ly, hx,hy, n2);
            CHECK(f);
            lx = hx, ly = hy;
         }
      }
      if (lx < n2) {
         // optimization of: draw_line(target, lx,ly, n,ly, n2);
         for (j=lx; j < n2; ++j)
            LINE_OP(target[j], inverse_db_table[ly]);
         CHECK(f);
      }
   }
   return TRUE;
}